

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O2

int __thiscall
CorUnix::CSynchCache<CorUnix::CSynchData>::Get
          (CSynchCache<CorUnix::CSynchData> *this,CPalThread *pthrCurrent,int n,CSynchData **ppObjs)

{
  _USynchCacheStackNode *p_Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  p_Var1 = (this->m_pHead).m_val;
  for (uVar3 = 0; (p_Var1 != (_USynchCacheStackNode *)0x0 && ((long)uVar3 < (long)n));
      uVar3 = uVar3 + 1) {
    ppObjs[uVar3] = (CSynchData *)p_Var1;
    p_Var1 = p_Var1->next;
  }
  (this->m_pHead).m_val = p_Var1;
  (this->m_iDepth).m_val = (this->m_iDepth).m_val - (int)uVar3;
  if (((this->m_pHead).m_val == (_USynchCacheStackNode *)0x0) && ((this->m_iDepth).m_val != 0)) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  uVar2 = (ulong)(uint)n;
  if (n <= (int)uVar3) {
    uVar2 = uVar3 & 0xffffffff;
  }
  do {
    uVar4 = uVar2;
    if (uVar2 == uVar3) {
LAB_0033dc52:
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        CSynchData::CSynchData(ppObjs[uVar3]);
      }
      return (int)uVar4;
    }
    p_Var1 = InternalNew<CorUnix::CSynchCache<CorUnix::CSynchData>::_USynchCacheStackNode>();
    if (p_Var1 == (_USynchCacheStackNode *)0x0) {
      uVar2 = uVar3 & 0xffffffff;
      uVar4 = uVar3;
      goto LAB_0033dc52;
    }
    memset(p_Var1,0,0x58);
    ppObjs[uVar3] = (CSynchData *)p_Var1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, T ** ppObjs)
        {
            void * pvObjRaw;
            USynchCacheStackNode * pNode;
            int i = 0,j;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {
                ppObjs[i] = (T *)pNode;
                pNode = pNode->next;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                // Can't use ASSERT here, since this is header
                // is included by other headers with inline methods
                // which causes template instatiation in the header
                // where the DEBUG CHANNEL is not defined and cannot
                // be defined
                fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                DebugBreak();
            }
#endif // _DEBUG

            Unlock(pthrCurrent);

            for (j=i;j<n;j++)
            {
                pvObjRaw = (void *) InternalNew<USynchCacheStackNode>();
                if (NULL == pvObjRaw)
                    break;
#ifdef _DEBUG
                memset(pvObjRaw, 0, sizeof(USynchCacheStackNode));
#endif
                ppObjs[j] = reinterpret_cast<T*>(pvObjRaw);
            }

            for (i=0;i<j;i++)
            {
                new ((void *)ppObjs[i]) T;
            }

            return j;
        }